

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O0

Vec_Int_t *
Amap_LibDeriveGatePerm_rec(Amap_Lib_t *pLib,Kit_DsdNtk_t *pNtk,int iLit,Amap_Nod_t *pNod)

{
  ushort uVar1;
  Kit_DsdNtk_t *pKVar2;
  Kit_DsdNtk_t *pLib_00;
  int iVar3;
  uint uVar4;
  Kit_DsdObj_t *pKVar5;
  Amap_Nod_t *pAVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p;
  Kit_DsdObj_t *pKVar8;
  Vec_Int_t *p_00;
  int local_84;
  int local_80;
  int j;
  int k;
  int i;
  int iDsdLit;
  int Value;
  int iNodFanin;
  int iDsdFanin;
  Amap_Nod_t *pNodFanin;
  Kit_DsdObj_t *pDsdFanin;
  Kit_DsdObj_t *pDsdObj;
  Vec_Int_t *vDsdLits;
  Vec_Int_t *vNodFanin;
  Vec_Int_t *vPermFanin;
  Vec_Int_t *vPerm;
  Amap_Nod_t *pNod_local;
  Kit_DsdNtk_t *pKStack_20;
  int iLit_local;
  Kit_DsdNtk_t *pNtk_local;
  Amap_Lib_t *pLib_local;
  
  vPerm = (Vec_Int_t *)pNod;
  pNod_local._4_4_ = iLit;
  pKStack_20 = pNtk;
  pNtk_local = (Kit_DsdNtk_t *)pLib;
  iVar3 = Abc_Lit2Var(iLit);
  pKVar5 = Kit_DsdNtkObj(pNtk,iVar3);
  if (pKVar5 == (Kit_DsdObj_t *)0x0) {
    vPermFanin = Vec_IntAlloc(1);
    Vec_IntPush(vPermFanin,pNod_local._4_4_);
    pLib_local = (Amap_Lib_t *)vPermFanin;
  }
  else if ((((uint)*pKVar5 >> 6 & 7) == 5) && ((uint)vPerm->nCap >> 0x18 == 6)) {
    vPermFanin = Vec_IntAlloc(10);
    pKVar2 = pNtk_local;
    uVar1 = *(ushort *)(pKVar5 + 1);
    iVar3 = Abc_Lit2Var((int)(short)vPerm->nSize);
    pAVar6 = Amap_LibNod((Amap_Lib_t *)pKVar2,iVar3);
    pVVar7 = Amap_LibDeriveGatePerm_rec((Amap_Lib_t *)pNtk_local,pKStack_20,(uint)uVar1,pAVar6);
    if (pVVar7 == (Vec_Int_t *)0x0) {
      Vec_IntFree(vPermFanin);
      pLib_local = (Amap_Lib_t *)0x0;
    }
    else {
      for (local_80 = 0; iVar3 = Vec_IntSize(pVVar7), local_80 < iVar3; local_80 = local_80 + 1) {
        iVar3 = Vec_IntEntry(pVVar7,local_80);
        Vec_IntPush(vPermFanin,iVar3);
      }
      Vec_IntFree(pVVar7);
      pKVar2 = pNtk_local;
      uVar1 = *(ushort *)&pKVar5[1].field_0x2;
      iVar3 = Abc_Lit2Var((int)*(short *)((long)&vPerm->nSize + 2));
      pAVar6 = Amap_LibNod((Amap_Lib_t *)pKVar2,iVar3);
      pVVar7 = Amap_LibDeriveGatePerm_rec((Amap_Lib_t *)pNtk_local,pKStack_20,(uint)uVar1,pAVar6);
      if (pVVar7 == (Vec_Int_t *)0x0) {
        Vec_IntFree(vPermFanin);
        pLib_local = (Amap_Lib_t *)0x0;
      }
      else {
        for (local_80 = 0; iVar3 = Vec_IntSize(pVVar7), local_80 < iVar3; local_80 = local_80 + 1) {
          iVar3 = Vec_IntEntry(pVVar7,local_80);
          Vec_IntPush(vPermFanin,iVar3);
        }
        Vec_IntFree(pVVar7);
        pKVar2 = pNtk_local;
        uVar1 = *(ushort *)(pKVar5 + 2);
        iVar3 = Abc_Lit2Var((int)*(short *)&vPerm->pArray);
        pAVar6 = Amap_LibNod((Amap_Lib_t *)pKVar2,iVar3);
        pVVar7 = Amap_LibDeriveGatePerm_rec((Amap_Lib_t *)pNtk_local,pKStack_20,(uint)uVar1,pAVar6);
        if (pVVar7 == (Vec_Int_t *)0x0) {
          Vec_IntFree(vPermFanin);
          pLib_local = (Amap_Lib_t *)0x0;
        }
        else {
          for (local_80 = 0; iVar3 = Vec_IntSize(pVVar7), local_80 < iVar3; local_80 = local_80 + 1)
          {
            iVar3 = Vec_IntEntry(pVVar7,local_80);
            Vec_IntPush(vPermFanin,iVar3);
          }
          Vec_IntFree(pVVar7);
          pLib_local = (Amap_Lib_t *)vPermFanin;
        }
      }
    }
  }
  else if ((((uint)*pKVar5 >> 6 & 7) == 5) || ((uint)vPerm->nCap >> 0x18 == 6)) {
    pLib_local = (Amap_Lib_t *)0x0;
  }
  else {
    pVVar7 = Amap_LibCollectFanins((Amap_Lib_t *)pNtk_local,(Amap_Nod_t *)vPerm);
    uVar4 = Vec_IntSize(pVVar7);
    if (uVar4 == (uint)*pKVar5 >> 0x1a) {
      vPermFanin = Vec_IntAlloc(10);
      p = Vec_IntAlloc(10);
      j = (uint)*pKVar5 >> 0x1a;
      while (pKVar2 = pKStack_20, j = j - 1, -1 < j) {
        uVar1 = *(ushort *)(&pKVar5[1].field_0x0 + (long)j * 2);
        iVar3 = Abc_Lit2Var((uint)uVar1);
        pKVar8 = Kit_DsdNtkObj(pKVar2,iVar3);
        if (pKVar8 == (Kit_DsdObj_t *)0x0) {
          Vec_IntPush(p,(uint)uVar1);
        }
        else {
          *pKVar8 = (Kit_DsdObj_t)((uint)*pKVar8 & 0xfffffdff);
        }
      }
      k = 0;
      for (local_80 = 0; iVar3 = Vec_IntSize(pVVar7), local_80 < iVar3; local_80 = local_80 + 1) {
        iVar3 = Vec_IntEntry(pVVar7,local_80);
        pKVar2 = pNtk_local;
        if (iVar3 == 0) {
          iVar3 = Vec_IntSize(p);
          if (iVar3 <= k) {
            Vec_IntFree(vPermFanin);
            Vec_IntFree(p);
            Vec_IntFree(pVVar7);
            return (Vec_Int_t *)0x0;
          }
          iVar3 = Vec_IntEntry(p,k);
          Vec_IntPush(vPermFanin,iVar3);
          k = k + 1;
        }
        else {
          iVar3 = Abc_Lit2Var(iVar3);
          pAVar6 = Amap_LibNod((Amap_Lib_t *)pKVar2,iVar3);
          j = (uint)*pKVar5 >> 0x1a;
          do {
            pKVar2 = pKStack_20;
            j = j - 1;
            if (j < 0) goto LAB_00b6841e;
            uVar1 = *(ushort *)(&pKVar5[1].field_0x0 + (long)j * 2);
            iVar3 = Abc_Lit2Var((uint)uVar1);
            pKVar8 = Kit_DsdNtkObj(pKVar2,iVar3);
            pLib_00 = pNtk_local;
            pKVar2 = pKStack_20;
          } while (((pKVar8 == (Kit_DsdObj_t *)0x0) || (((uint)*pKVar8 >> 9 & 1) == 1)) ||
                  ((((((uint)*pKVar8 >> 6 & 7) != 3 || (*(uint *)pAVar6 >> 0x18 != 4)) &&
                    ((((uint)*pKVar8 >> 6 & 7) != 4 || (*(uint *)pAVar6 >> 0x18 != 5)))) &&
                   ((((uint)*pKVar8 >> 6 & 7) != 5 || (*(uint *)pAVar6 >> 0x18 != 6))))));
          iVar3 = Abc_LitRegular((uint)uVar1);
          p_00 = Amap_LibDeriveGatePerm_rec((Amap_Lib_t *)pLib_00,pKVar2,iVar3,pAVar6);
          if (p_00 == (Vec_Int_t *)0x0) {
            Vec_IntFree(pVVar7);
            Vec_IntFree(p);
            Vec_IntFree(vPermFanin);
            return (Vec_Int_t *)0x0;
          }
          *pKVar8 = (Kit_DsdObj_t)((uint)*pKVar8 & 0xfffffdff | 0x200);
          for (local_84 = 0; iVar3 = Vec_IntSize(p_00), local_84 < iVar3; local_84 = local_84 + 1) {
            iVar3 = Vec_IntEntry(p_00,local_84);
            Vec_IntPush(vPermFanin,iVar3);
          }
          Vec_IntFree(p_00);
        }
LAB_00b6841e:
      }
      iVar3 = Vec_IntSize(p);
      if (k != iVar3) {
        Vec_IntFreeP(&vPermFanin);
      }
      Vec_IntFree(pVVar7);
      Vec_IntFree(p);
      pLib_local = (Amap_Lib_t *)vPermFanin;
    }
    else {
      Vec_IntFree(pVVar7);
      pLib_local = (Amap_Lib_t *)0x0;
    }
  }
  return (Vec_Int_t *)pLib_local;
}

Assistant:

Vec_Int_t * Amap_LibDeriveGatePerm_rec( Amap_Lib_t * pLib, Kit_DsdNtk_t * pNtk, int iLit, Amap_Nod_t * pNod )
{
    Vec_Int_t * vPerm, * vPermFanin, * vNodFanin, * vDsdLits;
    Kit_DsdObj_t * pDsdObj, * pDsdFanin;
    Amap_Nod_t * pNodFanin;
    int iDsdFanin, iNodFanin, Value, iDsdLit, i, k, j;
//    assert( !Abc_LitIsCompl(iLit) );
    pDsdObj = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iLit) );
    if ( pDsdObj == NULL )
    {
        vPerm = Vec_IntAlloc( 1 );
        Vec_IntPush( vPerm, iLit );
        return vPerm;
    }
    if ( pDsdObj->Type == KIT_DSD_PRIME && pNod->Type == AMAP_OBJ_MUX )
    {
        vPerm = Vec_IntAlloc( 10 );

        iDsdFanin  = pDsdObj->pFans[0];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan0) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        iDsdFanin  = pDsdObj->pFans[1];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan1) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        iDsdFanin  = pDsdObj->pFans[2];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan2) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        return vPerm;
    }
    // return if wrong types
    if ( pDsdObj->Type == KIT_DSD_PRIME || pNod->Type == AMAP_OBJ_MUX )
        return NULL;
    // return if sizes do not agree
    vNodFanin = Amap_LibCollectFanins( pLib, pNod );
    if ( Vec_IntSize(vNodFanin) != (int)pDsdObj->nFans )
    {
        Vec_IntFree( vNodFanin );
        return NULL;
    }
    // match fanins of DSD with fanins of nodes
    // clean the mark and save variable literals
    vPerm = Vec_IntAlloc( 10 );
    vDsdLits = Vec_IntAlloc( 10 );
    Kit_DsdObjForEachFaninReverse( pNtk, pDsdObj, iDsdFanin, i )
    {
        pDsdFanin = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iDsdFanin) );
        if ( pDsdFanin )
            pDsdFanin->fMark = 0;
        else
            Vec_IntPush( vDsdLits, iDsdFanin );
    }
    // match each fanins of the node
    iDsdLit = 0;
    Vec_IntForEachEntry( vNodFanin, iNodFanin, k )
    {
        if ( iNodFanin == 0 )
        {
            if ( iDsdLit >= Vec_IntSize(vDsdLits) )
            {
                Vec_IntFree( vPerm );
                Vec_IntFree( vDsdLits );
                Vec_IntFree( vNodFanin );
                return NULL;
            }
            iDsdFanin = Vec_IntEntry( vDsdLits, iDsdLit++ );
            Vec_IntPush( vPerm, iDsdFanin );
            continue;
        }
        // find a matching component
        pNodFanin = Amap_LibNod( pLib, Abc_Lit2Var(iNodFanin) );
        Kit_DsdObjForEachFaninReverse( pNtk, pDsdObj, iDsdFanin, i )
        {
            pDsdFanin = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iDsdFanin) );
            if ( pDsdFanin == NULL )
                continue;
            if ( pDsdFanin->fMark == 1 )
                continue;
            if ( !((pDsdFanin->Type == KIT_DSD_AND && pNodFanin->Type == AMAP_OBJ_AND) ||
                   (pDsdFanin->Type == KIT_DSD_XOR && pNodFanin->Type == AMAP_OBJ_XOR) ||
                   (pDsdFanin->Type == KIT_DSD_PRIME && pNodFanin->Type == AMAP_OBJ_MUX)) )
                   continue;
            vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, Abc_LitRegular(iDsdFanin), pNodFanin );
            if ( vPermFanin == NULL )
            {
                Vec_IntFree( vNodFanin );
                Vec_IntFree( vDsdLits );
                Vec_IntFree( vPerm );
                return NULL;
            }
            pDsdFanin->fMark = 1;
            Vec_IntForEachEntry( vPermFanin, Value, j )
                Vec_IntPush( vPerm, Value );
            Vec_IntFree( vPermFanin );
            break;
        }
    }
//    assert( iDsdLit == Vec_IntSize(vDsdLits) );
    if ( iDsdLit != Vec_IntSize(vDsdLits) )
        Vec_IntFreeP( &vPerm );
    Vec_IntFree( vNodFanin );
    Vec_IntFree( vDsdLits );
    return vPerm;
}